

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O1

void __thiscall QPDFWriter::setOutputFilename(QPDFWriter *this,char *filename)

{
  FILE *file;
  char *description;
  
  file = _stdout;
  if (filename == (char *)0x0) {
    QUtil::binary_stdout();
    description = "standard output";
  }
  else {
    file = QUtil::safe_fopen(filename,"wb+");
    description = filename;
  }
  setOutputFile(this,description,file,filename != (char *)0x0);
  return;
}

Assistant:

void
QPDFWriter::setOutputFilename(char const* filename)
{
    char const* description = filename;
    FILE* f = nullptr;
    bool close_file = false;
    if (filename == nullptr) {
        description = "standard output";
        QTC::TC("qpdf", "QPDFWriter write to stdout");
        f = stdout;
        QUtil::binary_stdout();
    } else {
        QTC::TC("qpdf", "QPDFWriter write to file");
        f = QUtil::safe_fopen(filename, "wb+");
        close_file = true;
    }
    setOutputFile(description, f, close_file);
}